

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

int log_create(char *name)

{
  int iVar1;
  log_impl impl;
  char *name_00;
  int iVar2;
  
  impl = log_impl_create(name);
  iVar2 = 1;
  if (impl != (log_impl)0x0) {
    name_00 = log_impl_name(impl);
    iVar1 = log_singleton_insert(name_00,impl);
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      log_impl_destroy(impl);
    }
  }
  return iVar2;
}

Assistant:

int log_create(const char *name)
{
	log_impl impl = log_impl_create(name);

	if (impl == NULL)
	{
		return 1;
	}

	if (log_singleton_insert(log_impl_name(impl), impl) != 0)
	{
		log_impl_destroy(impl);

		return 1;
	}

	return 0;
}